

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  u8 *puVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined6 in_register_00000012;
  ulong uVar7;
  ulong uVar8;
  undefined6 in_register_00000032;
  ushort uVar9;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  ushort uVar15;
  uint uVar16;
  ulong uVar10;
  
  uVar8 = CONCAT62(in_register_00000032,iStart);
  uVar7 = CONCAT62(in_register_00000012,iSize) & 0xffffffff;
  iVar3 = (int)CONCAT62(in_register_00000012,iSize);
  uVar13 = (uint)uVar8;
  uVar6 = iVar3 + uVar13;
  puVar2 = pPage->aData;
  uVar4 = (ulong)pPage->hdrOffset;
  uVar1 = uVar4 + 1;
  uVar10 = uVar1;
  if ((puVar2[uVar4 + 2] == '\0') && (puVar2[uVar1] == '\0')) {
    uVar9 = 0;
    uVar11 = uVar1;
  }
  else {
    do {
      uVar11 = uVar10;
      uVar15 = *(ushort *)(puVar2 + uVar11);
      uVar9 = uVar15 << 8 | uVar15 >> 8;
      uVar10 = (ulong)uVar9;
      if (iStart <= uVar9) goto LAB_00167a32;
    } while ((ushort)uVar11 < uVar9);
    if (uVar9 != 0) {
      uVar5 = 0x11110;
      goto LAB_00167c9e;
    }
LAB_00167a32:
    uVar12 = pPage->pBt->usableSize;
    uVar16 = (uint)uVar9;
    if (uVar12 - 4 < uVar16) {
      uVar5 = 0x11115;
      goto LAB_00167c9e;
    }
    if (uVar6 + 3 < uVar16 || uVar9 == 0) {
      bVar14 = 0;
    }
    else {
      bVar14 = (char)(uVar15 >> 8) - (char)uVar6;
      if (uVar9 < uVar6) {
        uVar5 = 0x11121;
        goto LAB_00167c9e;
      }
      uVar6 = (ushort)(*(ushort *)(puVar2 + uVar10 + 2) << 8 | *(ushort *)(puVar2 + uVar10 + 2) >> 8
                      ) + uVar16;
      if (uVar12 < uVar6) {
        uVar5 = 0x11124;
        goto LAB_00167c9e;
      }
      uVar7 = (ulong)(uVar6 - uVar13);
      uVar9 = *(ushort *)(puVar2 + uVar10) << 8 | *(ushort *)(puVar2 + uVar10) >> 8;
    }
    uVar12 = (uint)uVar11;
    if (((uint)uVar1 < uVar12) &&
       (uVar15 = *(ushort *)(puVar2 + uVar11 + 2) << 8 | *(ushort *)(puVar2 + uVar11 + 2) >> 8,
       uVar13 <= uVar15 + uVar12 + 3)) {
      uVar16 = uVar15 + uVar12;
      if (uVar13 < uVar16) {
        uVar5 = 0x11131;
        goto LAB_00167c9e;
      }
      bVar14 = bVar14 + ((char)iStart - (char)uVar16);
      uVar7 = (ulong)(uVar6 - uVar12);
      uVar8 = uVar11;
    }
    if (puVar2[uVar4 + 7] < bVar14) {
      uVar5 = 0x11137;
      goto LAB_00167c9e;
    }
    puVar2[uVar4 + 7] = puVar2[uVar4 + 7] - bVar14;
    uVar13 = (uint)uVar8 & 0xffff;
  }
  uVar12 = (uint)(ushort)(*(ushort *)(puVar2 + uVar4 + 5) << 8 |
                         *(ushort *)(puVar2 + uVar4 + 5) >> 8);
  if (uVar13 <= uVar12) {
    if (uVar13 < uVar12) {
      uVar5 = 0x11140;
    }
    else {
      if ((uint)uVar1 == (uint)uVar11) {
        *(ushort *)(puVar2 + uVar1) = uVar9 << 8 | uVar9 >> 8;
        puVar2[uVar4 + 5] = (u8)(uVar6 >> 8);
        puVar2[uVar4 + 6] = (u8)uVar6;
        goto LAB_00167bf0;
      }
      uVar5 = 0x11141;
    }
LAB_00167c9e:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar5,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    return 0xb;
  }
  *(ushort *)(puVar2 + uVar11) = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
LAB_00167bf0:
  uVar8 = uVar8 & 0xffff;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar2 + uVar8,0,uVar7 & 0xffff);
  }
  puVar2[uVar8] = (u8)(uVar9 >> 8);
  puVar2[uVar8 + 1] = (u8)uVar9;
  puVar2[uVar8 + 2] = (u8)(uVar7 >> 8);
  puVar2[uVar8 + 3] = (u8)uVar7;
  pPage->nFree = pPage->nFree + iVar3;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */
  u8 *pTmp;                             /* Temporary ptr into data[] */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<=iPtr ){
        if( iFreeBlk==0 ) break; /* TH3: corrupt082.100 */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){ /* TH3: corrupt081.100 */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 || CORRUPT_DB );

    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }

    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  pTmp = &data[hdr+5];
  x = get2byte(pTmp);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}